

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSat.c
# Opt level: O3

void Ssc_ManCnfNodeAddToSolver(Ssc_Man_t *p,int NodeId)

{
  Gia_Obj_t *pGVar1;
  lit *plVar2;
  bool bVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  long lVar6;
  Gia_Obj_t *pGVar7;
  Gia_Man_t *pGVar8;
  Gia_Obj_t *pGVar9;
  int *piVar10;
  Gia_Obj_t *pGVar11;
  long lVar12;
  undefined8 uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  Gia_Obj_t *pGVar17;
  uint uVar18;
  uint uVar19;
  timespec ts;
  Gia_Obj_t *pNodeE;
  Gia_Obj_t *pNodeT;
  timespec local_78;
  long local_68;
  ulong local_60;
  uint local_54;
  uint local_50;
  uint local_4c;
  long local_48;
  Gia_Obj_t *local_40;
  Gia_Obj_t *local_38;
  
  if (NodeId < 1) {
    __assert_fail("NodeId > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                  ,0xd5,"void Ssc_ManCnfNodeAddToSolver(Ssc_Man_t *, int)");
  }
  if (p->vId2Var->nSize <= NodeId) {
LAB_006439de:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  if (p->vId2Var->pArray[(uint)NodeId] == 0) {
    iVar4 = clock_gettime(3,&local_78);
    if (iVar4 < 0) {
      local_68 = 1;
    }
    else {
      lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                      SEXT816(CONCAT44(local_78.tv_nsec._4_4_,(uint)local_78.tv_nsec)),8);
      local_68 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) +
                 CONCAT44(local_78.tv_sec._4_4_,(uint)local_78.tv_sec) * -1000000;
    }
    pVVar5 = p->vFront;
    pVVar5->nSize = 0;
    Ssc_ManCnfAddToFrontier(p,NodeId,pVVar5);
    pVVar5 = p->vFront;
    if (0 < pVVar5->nSize) {
      lVar12 = 0;
      do {
        iVar4 = pVVar5->pArray[lVar12];
        lVar6 = (long)iVar4;
        if ((lVar6 < 0) || (p->pFraig->nObjs <= iVar4)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar17 = p->pFraig->pObjs;
        if (pGVar17 == (Gia_Obj_t *)0x0) break;
        if (p->vId2Var->nSize <= iVar4) goto LAB_006439de;
        if (p->vId2Var->pArray[lVar6] == 0) {
          __assert_fail("Ssc_ObjSatVar(p, Gia_ObjId(p->pFraig, pNode))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                        ,0xe1,"void Ssc_ManCnfNodeAddToSolver(Ssc_Man_t *, int)");
        }
        pGVar17 = pGVar17 + lVar6;
        iVar4 = Gia_ObjIsMuxType(pGVar17);
        if (iVar4 == 0) {
          if (((ulong)pGVar17 & 1) != 0) {
            __assert_fail("!Gia_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                          ,0xb2,"void Ssc_ManCollectSuper(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
          }
          if (((int)(uint)*(undefined8 *)pGVar17 < 0) ||
             (((uint)*(undefined8 *)pGVar17 & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsAnd(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                          ,0xb3,"void Ssc_ManCollectSuper(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
          }
          pGVar8 = p->pFraig;
          pVVar5 = p->vFanins;
          pVVar5->nSize = 0;
          Ssc_ManCollectSuper_rec
                    (pGVar8,(Gia_Obj_t *)
                            ((ulong)((uint)(*(ulong *)pGVar17 >> 0x1d) & 1) |
                            (ulong)(pGVar17 + -(*(ulong *)pGVar17 & 0x1fffffff))),pVVar5);
          Ssc_ManCollectSuper_rec
                    (pGVar8,(Gia_Obj_t *)
                            ((ulong)((uint)(*(ulong *)pGVar17 >> 0x3d) & 1) |
                            (ulong)(pGVar17 + -(*(ulong *)pGVar17 >> 0x20 & 0x1fffffff))),pVVar5);
          pVVar5 = p->vFanins;
          if (pVVar5->nSize < 1) {
            bVar3 = false;
          }
          else {
            lVar6 = 0;
            do {
              if (pVVar5->pArray[lVar6] < 0) goto LAB_006439a0;
              Ssc_ManCnfAddToFrontier(p,(uint)pVVar5->pArray[lVar6] >> 1,p->vFront);
              lVar6 = lVar6 + 1;
              pVVar5 = p->vFanins;
            } while (lVar6 < pVVar5->nSize);
            bVar3 = 0 < pVVar5->nSize;
          }
          if (((int)(uint)*(undefined8 *)pGVar17 < 0) ||
             (((uint)*(undefined8 *)pGVar17 & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsAnd( pNode )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                          ,0x84,"void Gia_ManAddClausesSuper(Ssc_Man_t *, Gia_Obj_t *, Vec_Int_t *)"
                         );
          }
          pGVar11 = p->pFraig->pObjs;
          if ((pGVar17 < pGVar11) || (pGVar11 + p->pFraig->nObjs <= pGVar17)) goto LAB_006439fd;
          uVar14 = (int)((long)pGVar17 - (long)pGVar11 >> 2) * -0x55555555;
          if ((int)uVar14 < 0) {
LAB_006439bf:
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          if (p->vId2Var->nSize <= (int)uVar14) goto LAB_006439de;
          iVar4 = p->vId2Var->pArray[uVar14 & 0x7fffffff];
          if (iVar4 < 0) goto LAB_006439bf;
          uVar14 = iVar4 * 2;
          if (bVar3) {
            piVar10 = pVVar5->pArray;
            lVar6 = 0;
            do {
              uVar15 = piVar10[lVar6];
              if ((int)uVar15 < 0) {
LAB_006439a0:
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                              ,0x12f,"int Abc_Lit2Var(int)");
              }
              if (p->vId2Var->nSize <= (int)(uVar15 >> 1)) goto LAB_006439de;
              iVar4 = p->vId2Var->pArray[uVar15 >> 1];
              if (iVar4 < 0) goto LAB_006439bf;
              local_78.tv_sec._0_4_ = (uVar15 & 1) + iVar4 * 2;
              local_78.tv_sec._4_4_ = uVar14 | 1;
              iVar4 = sat_solver_addclause(p->pSat,(lit *)&local_78,(lit *)&local_78.tv_nsec);
              if (iVar4 == 0) {
                __assert_fail("RetValue",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                              ,0x8e,
                              "void Gia_ManAddClausesSuper(Ssc_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
              }
              if ((int)(uint)local_78.tv_sec < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                              ,0x131,"int Abc_LitNot(int)");
              }
              if (pVVar5->nSize <= lVar6) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              piVar10 = pVVar5->pArray;
              piVar10[lVar6] = (uint)local_78.tv_sec ^ 1;
              lVar6 = lVar6 + 1;
            } while (lVar6 < pVVar5->nSize);
          }
          Vec_IntPush(pVVar5,uVar14);
          iVar4 = sat_solver_addclause(p->pSat,pVVar5->pArray,pVVar5->pArray + pVVar5->nSize);
          if (iVar4 == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                          ,0x95,"void Gia_ManAddClausesSuper(Ssc_Man_t *, Gia_Obj_t *, Vec_Int_t *)"
                         );
          }
        }
        else {
          pVVar5 = p->vFanins;
          pVVar5->nSize = 0;
          pGVar7 = pGVar17 + -(ulong)((uint)*(undefined8 *)pGVar17 & 0x1fffffff);
          pGVar11 = p->pFraig->pObjs;
          if ((pGVar7 < pGVar11) || (pGVar11 + p->pFraig->nObjs <= pGVar7)) {
LAB_006439fd:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(pVVar5,(int)((ulong)((long)pGVar7 - (long)pGVar11) >> 2) * -0x55555555 -
                             (*(uint *)pGVar7 & 0x1fffffff));
          pGVar8 = p->pFraig;
          uVar13 = *(undefined8 *)pGVar17;
          pGVar7 = pGVar17 + -(ulong)((uint)((ulong)uVar13 >> 0x20) & 0x1fffffff);
          pGVar11 = pGVar8->pObjs;
          if ((pGVar7 < pGVar11) || (pGVar11 + pGVar8->nObjs <= pGVar7)) goto LAB_006439fd;
          pVVar5 = p->vFanins;
          iVar4 = (int)((ulong)((long)pGVar7 - (long)pGVar11) >> 2) * -0x55555555 -
                  (*(uint *)pGVar7 & 0x1fffffff);
          if (0 < (long)pVVar5->nSize) {
            lVar6 = 0;
            do {
              if (pVVar5->pArray[lVar6] == iVar4) goto LAB_006432e6;
              lVar6 = lVar6 + 1;
            } while (pVVar5->nSize != lVar6);
          }
          Vec_IntPush(pVVar5,iVar4);
          pGVar8 = p->pFraig;
          pVVar5 = p->vFanins;
          uVar13 = *(undefined8 *)pGVar17;
          pGVar11 = pGVar8->pObjs;
LAB_006432e6:
          pGVar7 = pGVar17 + -(ulong)((uint)uVar13 & 0x1fffffff);
          if ((pGVar7 < pGVar11) || (pGVar11 + pGVar8->nObjs <= pGVar7)) goto LAB_006439fd;
          iVar4 = (int)((ulong)((long)pGVar7 - (long)pGVar11) >> 2) * -0x55555555 -
                  (*(uint *)&pGVar7->field_0x4 & 0x1fffffff);
          if (0 < (long)pVVar5->nSize) {
            lVar6 = 0;
            do {
              if (pVVar5->pArray[lVar6] == iVar4) goto LAB_0064336b;
              lVar6 = lVar6 + 1;
            } while (pVVar5->nSize != lVar6);
          }
          Vec_IntPush(pVVar5,iVar4);
          pGVar8 = p->pFraig;
          pVVar5 = p->vFanins;
          uVar13 = *(undefined8 *)pGVar17;
          pGVar11 = pGVar8->pObjs;
LAB_0064336b:
          pGVar7 = pGVar17 + -(ulong)((uint)((ulong)uVar13 >> 0x20) & 0x1fffffff);
          if ((pGVar7 < pGVar11) || (pGVar11 + pGVar8->nObjs <= pGVar7)) goto LAB_006439fd;
          iVar4 = (int)((ulong)((long)pGVar7 - (long)pGVar11) >> 2) * -0x55555555 -
                  (*(uint *)&pGVar7->field_0x4 & 0x1fffffff);
          if (0 < (long)pVVar5->nSize) {
            lVar6 = 0;
            do {
              if (pVVar5->pArray[lVar6] == iVar4) goto LAB_006433e8;
              lVar6 = lVar6 + 1;
            } while (pVVar5->nSize != lVar6);
          }
          Vec_IntPush(pVVar5,iVar4);
          pVVar5 = p->vFanins;
          if (0 < pVVar5->nSize) {
LAB_006433e8:
            lVar6 = 0;
            do {
              Ssc_ManCnfAddToFrontier(p,pVVar5->pArray[lVar6],p->vFront);
              lVar6 = lVar6 + 1;
              pVVar5 = p->vFanins;
            } while (lVar6 < pVVar5->nSize);
          }
          if (((ulong)pGVar17 & 1) != 0) {
            __assert_fail("!Gia_IsComplement( pNode )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                          ,0x35,"void Gia_ManAddClausesMux(Ssc_Man_t *, Gia_Obj_t *)");
          }
          iVar4 = Gia_ObjIsMuxType(pGVar17);
          if (iVar4 == 0) {
            __assert_fail("Gia_ObjIsMuxType( pNode )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                          ,0x36,"void Gia_ManAddClausesMux(Ssc_Man_t *, Gia_Obj_t *)");
          }
          pGVar9 = Gia_ObjRecognizeMux(pGVar17,&local_38,&local_40);
          pGVar7 = local_40;
          pGVar11 = p->pFraig->pObjs;
          if ((pGVar17 < pGVar11) || (pGVar1 = pGVar11 + p->pFraig->nObjs, pGVar1 <= pGVar17))
          goto LAB_006439fd;
          uVar14 = (int)((long)pGVar17 - (long)pGVar11 >> 2) * -0x55555555;
          if ((int)uVar14 < 0) goto LAB_006439bf;
          uVar15 = p->vId2Var->nSize;
          if ((int)uVar15 <= (int)uVar14) goto LAB_006439de;
          piVar10 = p->vId2Var->pArray;
          if (piVar10[uVar14 & 0x7fffffff] < 0) goto LAB_006439bf;
          pGVar17 = (Gia_Obj_t *)((ulong)pGVar9 & 0xfffffffffffffffe);
          if ((pGVar17 < pGVar11) || (pGVar1 <= pGVar17)) goto LAB_006439fd;
          uVar16 = (int)((long)pGVar17 - (long)pGVar11 >> 2) * -0x55555555;
          if ((int)uVar16 < 0) goto LAB_006439bf;
          if (uVar15 <= uVar16) goto LAB_006439de;
          if (piVar10[uVar16 & 0x7fffffff] < 0) goto LAB_006439bf;
          pGVar17 = (Gia_Obj_t *)((ulong)local_38 & 0xfffffffffffffffe);
          if ((pGVar17 < pGVar11) || (pGVar1 <= pGVar17)) goto LAB_006439fd;
          uVar18 = (int)((long)pGVar17 - (long)pGVar11 >> 2) * -0x55555555;
          if ((int)uVar18 < 0) goto LAB_006439bf;
          if (uVar15 <= uVar18) goto LAB_006439de;
          if (piVar10[uVar18 & 0x7fffffff] < 0) goto LAB_006439bf;
          pGVar17 = (Gia_Obj_t *)((ulong)local_40 & 0xfffffffffffffffe);
          if ((pGVar17 < pGVar11) || (pGVar1 <= pGVar17)) goto LAB_006439fd;
          uVar19 = (int)((long)pGVar17 - (long)pGVar11 >> 2) * -0x55555555;
          if ((int)uVar19 < 0) goto LAB_006439bf;
          if (uVar15 <= uVar19) goto LAB_006439de;
          plVar2 = (lit *)((long)&local_78.tv_nsec + 4);
          local_60 = (ulong)(uint)piVar10[uVar19 & 0x7fffffff];
          local_48 = lVar12;
          if (piVar10[uVar19 & 0x7fffffff] < 0) goto LAB_006439bf;
          uVar14 = piVar10[uVar14 & 0x7fffffff] * 2;
          local_4c = ((uint)pGVar9 & 1) + piVar10[uVar16 & 0x7fffffff] * 2;
          uVar16 = ((uint)local_38 & 1) + piVar10[uVar18 & 0x7fffffff] * 2;
          uVar15 = local_4c ^ 1;
          local_78.tv_sec._4_4_ = uVar16 ^ 1;
          local_78.tv_sec._0_4_ = uVar15;
          local_78.tv_nsec._0_4_ = uVar14;
          local_54 = local_78.tv_sec._4_4_;
          iVar4 = sat_solver_addclause(p->pSat,(lit *)&local_78,plVar2);
          if (iVar4 == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                          ,0x4b,"void Gia_ManAddClausesMux(Ssc_Man_t *, Gia_Obj_t *)");
          }
          uVar18 = uVar14 | 1;
          local_78.tv_sec._0_4_ = uVar15;
          local_78.tv_sec._4_4_ = uVar16;
          local_78.tv_nsec._0_4_ = uVar18;
          local_50 = uVar16;
          iVar4 = sat_solver_addclause(p->pSat,(lit *)&local_78,plVar2);
          uVar15 = local_4c;
          if (iVar4 == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                          ,0x50,"void Gia_ManAddClausesMux(Ssc_Man_t *, Gia_Obj_t *)");
          }
          uVar16 = ((uint)pGVar7 & 1) + (int)local_60 * 2;
          local_78.tv_sec._0_4_ = local_4c;
          local_60 = CONCAT44(local_60._4_4_,uVar14);
          local_78.tv_sec._4_4_ = uVar16 ^ 1;
          local_78.tv_nsec._0_4_ = uVar14;
          iVar4 = sat_solver_addclause
                            (p->pSat,(lit *)&local_78,(lit *)((long)&local_78.tv_nsec + 4));
          if (iVar4 == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                          ,0x55,"void Gia_ManAddClausesMux(Ssc_Man_t *, Gia_Obj_t *)");
          }
          local_78.tv_sec._0_4_ = uVar15;
          local_78.tv_sec._4_4_ = uVar16;
          local_78.tv_nsec._0_4_ = uVar18;
          iVar4 = sat_solver_addclause
                            (p->pSat,(lit *)&local_78,(lit *)((long)&local_78.tv_nsec + 4));
          if (iVar4 == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                          ,0x5a,"void Gia_ManAddClausesMux(Ssc_Man_t *, Gia_Obj_t *)");
          }
          lVar12 = local_48;
          if (local_50 != uVar16) {
            local_78.tv_sec._0_4_ = local_50;
            plVar2 = (lit *)((long)&local_78.tv_nsec + 4);
            local_78.tv_sec._4_4_ = uVar16;
            local_78.tv_nsec._0_4_ = uVar18;
            iVar4 = sat_solver_addclause(p->pSat,(lit *)&local_78,plVar2);
            if (iVar4 == 0) {
              __assert_fail("RetValue",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                            ,0x6d,"void Gia_ManAddClausesMux(Ssc_Man_t *, Gia_Obj_t *)");
            }
            local_78.tv_sec._0_4_ = local_54;
            local_78.tv_nsec._0_4_ = (uint)local_60;
            local_78.tv_sec._4_4_ = uVar16 ^ 1;
            iVar4 = sat_solver_addclause(p->pSat,(lit *)&local_78,plVar2);
            lVar12 = local_48;
            if (iVar4 == 0) {
              __assert_fail("RetValue",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                            ,0x72,"void Gia_ManAddClausesMux(Ssc_Man_t *, Gia_Obj_t *)");
            }
          }
        }
        if (p->vFanins->nSize < 2) {
          __assert_fail("Vec_IntSize(p->vFanins) > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                        ,0xf4,"void Ssc_ManCnfNodeAddToSolver(Ssc_Man_t *, int)");
        }
        lVar12 = lVar12 + 1;
        pVVar5 = p->vFront;
      } while (lVar12 < pVVar5->nSize);
    }
    iVar4 = clock_gettime(3,&local_78);
    if (iVar4 < 0) {
      lVar12 = -1;
    }
    else {
      lVar12 = CONCAT44(local_78.tv_nsec._4_4_,(uint)local_78.tv_nsec) / 1000 +
               CONCAT44(local_78.tv_sec._4_4_,(uint)local_78.tv_sec) * 1000000;
    }
    p->timeCnfGen = p->timeCnfGen + lVar12 + local_68;
  }
  return;
}

Assistant:

static void Ssc_ManCnfNodeAddToSolver( Ssc_Man_t * p, int NodeId )
{
    Gia_Obj_t * pNode;
    int i, k, Id, Lit;
    abctime clk;
    assert( NodeId > 0 );
    // quit if CNF is ready
    if ( Ssc_ObjSatVar(p, NodeId) )
        return;
clk = Abc_Clock();
    // start the frontier
    Vec_IntClear( p->vFront );
    Ssc_ManCnfAddToFrontier( p, NodeId, p->vFront );
    // explore nodes in the frontier
    Gia_ManForEachObjVec( p->vFront, p->pFraig, pNode, i )
    {
        // create the supergate
        assert( Ssc_ObjSatVar(p, Gia_ObjId(p->pFraig, pNode)) );
        if ( Gia_ObjIsMuxType(pNode) )
        {
            Vec_IntClear( p->vFanins );
            Vec_IntPushUnique( p->vFanins, Gia_ObjFaninId0p( p->pFraig, Gia_ObjFanin0(pNode) ) );
            Vec_IntPushUnique( p->vFanins, Gia_ObjFaninId0p( p->pFraig, Gia_ObjFanin1(pNode) ) );
            Vec_IntPushUnique( p->vFanins, Gia_ObjFaninId1p( p->pFraig, Gia_ObjFanin0(pNode) ) );
            Vec_IntPushUnique( p->vFanins, Gia_ObjFaninId1p( p->pFraig, Gia_ObjFanin1(pNode) ) );
            Vec_IntForEachEntry( p->vFanins, Id, k )
                Ssc_ManCnfAddToFrontier( p, Id, p->vFront );
            Gia_ManAddClausesMux( p, pNode );
        }
        else
        {
            Ssc_ManCollectSuper( p->pFraig, pNode, p->vFanins );
            Vec_IntForEachEntry( p->vFanins, Lit, k )
                Ssc_ManCnfAddToFrontier( p, Abc_Lit2Var(Lit), p->vFront );
            Gia_ManAddClausesSuper( p, pNode, p->vFanins );
        }
        assert( Vec_IntSize(p->vFanins) > 1 );
    }
p->timeCnfGen += Abc_Clock() - clk;
}